

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.cpp
# Opt level: O3

bool CoreML::hasIOS12Features(Model *model)

{
  uint32 uVar1;
  StringVector *pSVar2;
  Rep *pRVar3;
  bool bVar4;
  long lVar5;
  Pipeline *pPVar6;
  long lVar7;
  InternalMetadataWithArenaLite *pIVar8;
  void **ppvVar9;
  bool bVar10;
  WeightParamType local_24;
  
  uVar1 = model->_oneof_case_[0];
  if (uVar1 == 200) {
    pPVar6 = ((model->Type_).pipelineclassifier_)->pipeline_;
    if (pPVar6 == (Pipeline *)0x0) {
      pPVar6 = (Pipeline *)&Specification::_Pipeline_default_instance_;
    }
    pRVar3 = (pPVar6->models_).super_RepeatedPtrFieldBase.rep_;
    ppvVar9 = pRVar3->elements;
    if (pRVar3 == (Rep *)0x0) {
      ppvVar9 = (void **)0x0;
    }
    lVar5 = (long)(pPVar6->models_).super_RepeatedPtrFieldBase.current_size_;
    if (lVar5 != 0) {
      lVar7 = 0;
      do {
        bVar4 = hasIOS12Features(*(Model **)((long)ppvVar9 + lVar7));
        if (bVar4) {
          return bVar4;
        }
        bVar10 = lVar5 * 8 + -8 != lVar7;
        lVar7 = lVar7 + 8;
      } while (bVar10);
      return bVar4;
    }
  }
  else if (uVar1 == 0xc9) {
    pPVar6 = ((model->Type_).pipelineclassifier_)->pipeline_;
    if (pPVar6 == (Pipeline *)0x0) {
      pPVar6 = (Pipeline *)&Specification::_Pipeline_default_instance_;
    }
    pRVar3 = (pPVar6->models_).super_RepeatedPtrFieldBase.rep_;
    ppvVar9 = pRVar3->elements;
    if (pRVar3 == (Rep *)0x0) {
      ppvVar9 = (void **)0x0;
    }
    lVar5 = (long)(pPVar6->models_).super_RepeatedPtrFieldBase.current_size_;
    if (lVar5 != 0) {
      lVar7 = 0;
      do {
        bVar4 = hasIOS12Features(*(Model **)((long)ppvVar9 + lVar7));
        if (bVar4) {
          return bVar4;
        }
        bVar10 = lVar5 * 8 + -8 != lVar7;
        lVar7 = lVar7 + 8;
      } while (bVar10);
      return bVar4;
    }
  }
  else {
    if (uVar1 != 0xca) {
      bVar4 = hasFlexibleShapes(model);
      if (bVar4) {
        return true;
      }
      if (model->_oneof_case_[0] == 0x22b) {
        return true;
      }
      bVar4 = hasCategoricalSequences(model);
      if (bVar4) {
        return true;
      }
      if (model->_oneof_case_[0] - 2000 < 2) {
        return true;
      }
      if ((model->_oneof_case_[0] == 0x7d2) &&
         (((model->Type_).treeensembleregressor_)->_cached_size_ == 0x14)) {
        return true;
      }
      bVar4 = hasWeightOfType(model,&local_24);
      if (bVar4) {
        return true;
      }
      if (model->_oneof_case_[0] == 0x130) {
        return true;
      }
      if (model->_oneof_case_[0] == 0x262) {
        return true;
      }
      bVar4 = hasIOS12NewNeuralNetworkLayers(model);
      return bVar4;
    }
    pSVar2 = (((model->Type_).treeensembleclassifier_)->ClassLabels_).stringclasslabels_;
    pIVar8 = &pSVar2->_internal_metadata_;
    if (pSVar2 == (StringVector *)0x0) {
      pIVar8 = (InternalMetadataWithArenaLite *)0x0;
    }
    lVar5 = (long)((model->Type_).treeensembleclassifier_)->postevaluationtransform_;
    if (lVar5 != 0) {
      lVar7 = 0;
      do {
        bVar4 = hasIOS12Features(*(Model **)
                                  ((long)&(pIVar8->
                                          super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
                                          ).ptr_ + lVar7));
        if (bVar4) {
          return bVar4;
        }
        bVar10 = lVar5 * 8 + -8 != lVar7;
        lVar7 = lVar7 + 8;
      } while (bVar10);
      return bVar4;
    }
  }
  return false;
}

Assistant:

bool CoreML::hasIOS12Features(const Specification::Model& model) {
    // New IOS12 features: flexible shapes, custom model, sequence feature type,
    // text classifier, word tagger, vision feature print, unsigned integer quantization
    bool result = false;
    switch (model.Type_case()) {
        case Specification::Model::kPipeline:
            for (auto &m : model.pipeline().models()) {
                result = result || hasIOS12Features(m);
                if (result) {
                    return true;
                }
            }
            break;
        case Specification::Model::kPipelineRegressor:
            for (auto &m : model.pipelineregressor().pipeline().models()) {
                result = result ||hasIOS12Features(m);
                if (result) {
                    return true;
                }
            }
            break;
        case Specification::Model::kPipelineClassifier:
            for (auto &m : model.pipelineclassifier().pipeline().models()) {
                result = result || hasIOS12Features(m);
                if (result) {
                    return true;
                }
            }
            break;
        default:
            return (hasFlexibleShapes(model) || hasCustomModel(model) || hasCategoricalSequences(model) ||
                    hasAppleTextClassifier(model) || hasAppleWordTagger(model) ||
                    hasScenePrint(model) || hasUnsignedQuantizedWeights(model) ||
                    hasNonmaxSuppression(model) || hasBayesianProbitRegressor(model) ||
                    hasIOS12NewNeuralNetworkLayers(model));
    }
    return false;
}